

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O3

void __thiscall gdsForge::gdsBox(gdsForge *this,gdsBOX *in_BOX,bool minimal)

{
  FILE *pFVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pcVar4;
  size_type sVar5;
  long lVar6;
  _Alloc_hider _Var7;
  ulong uVar8;
  undefined7 in_register_00000011;
  ulong uVar9;
  pointer piVar10;
  undefined8 uStack_70;
  int aiStack_68 [2];
  string local_60;
  undefined1 *local_40;
  undefined4 local_38;
  uint local_34 [2];
  int data [1];
  
  local_40 = (undefined1 *)aiStack_68;
  lVar6 = -(((long)(in_BOX->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(in_BOX->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start) * 2 + 0xfU & 0xfffffffffffffff0);
  local_38 = 0x2d0400;
  pFVar1 = (FILE *)this->gdsFile;
  *(undefined8 *)((long)&uStack_70 + lVar6) = 0x11003a;
  fwrite(&local_38,1,4,pFVar1);
  if ((int)CONCAT71(in_register_00000011,minimal) == 0) {
    local_34[0] = in_BOX->plex;
    *(undefined8 *)((long)&uStack_70 + lVar6) = 0x11005a;
    GDSwriteInt(this,0x2f03,(int *)local_34,1);
  }
  local_34[0] = in_BOX->layer;
  *(undefined8 *)((long)&uStack_70 + lVar6) = 0x11007b;
  GDSwriteInt(this,0xd02,(int *)local_34,1);
  local_34[0] = in_BOX->boxtype;
  *(undefined8 *)((long)&uStack_70 + lVar6) = 0x110098;
  GDSwriteInt(this,0x2e02,(int *)local_34,1);
  piVar2 = (in_BOX->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (long)(in_BOX->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2;
  if (uVar8 != 0) {
    piVar3 = (in_BOX->yCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = 0;
    do {
      piVar10 = piVar3;
      if ((uVar9 & 1) == 0) {
        piVar10 = piVar2;
      }
      ((int *)((long)aiStack_68 + lVar6))[uVar9] = piVar10[uVar9 >> 1 & 0x7fffffff];
      uVar9 = uVar9 + 1;
    } while (((long)uVar8 >> 1) + (ulong)((long)uVar8 >> 1 == 0) != uVar9);
  }
  *(undefined8 *)((long)&uStack_70 + lVar6) = 0x1100f0;
  GDSwriteInt(this,0x1003,(int *)((long)aiStack_68 + lVar6),(uint)(uVar8 >> 1) & 0xfffffffe);
  if (!minimal) {
    local_34[0] = in_BOX->propattr;
    *(undefined8 *)((long)&uStack_70 + lVar6) = 0x110111;
    GDSwriteInt(this,0x2b02,(int *)local_34,1);
    pcVar4 = (in_BOX->propvalue)._M_dataplus._M_p;
    sVar5 = (in_BOX->propvalue)._M_string_length;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    *(undefined8 *)((long)&uStack_70 + lVar6) = 0x110130;
    std::__cxx11::string::_M_construct<char*>((string *)&local_60,pcVar4,pcVar4 + sVar5);
    *(undefined8 *)((long)&uStack_70 + lVar6) = 0x110140;
    GDSwriteStr(this,0x2c06,&local_60);
    _Var7._M_p = local_60._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      *(undefined8 *)((long)&uStack_70 + lVar6) = 0x110155;
      operator_delete(_Var7._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  local_38 = 0x110400;
  pFVar1 = (FILE *)this->gdsFile;
  *(undefined8 *)((long)&uStack_70 + lVar6) = 0x110172;
  fwrite(&local_38,1,4,pFVar1);
  return;
}

Assistant:

void gdsForge::gdsBox(const gdsBOX &in_BOX, bool minimal)
{
  int data[1];
  int corXY[in_BOX.xCor.size() * 2];

  this->GDSwriteRec(GDS_BOX);

  // ELFLAGS and PLEX are optional
  if (minimal == false) {
    data[0] = in_BOX.plex;
    this->GDSwriteInt(GDS_PLEX, data, 1);
  }

  // Layer number, 0 to 63
  data[0] = in_BOX.layer;
  this->GDSwriteInt(GDS_LAYER, data, 1);

  // unimportant, set to zero.
  data[0] = in_BOX.boxtype;
  this->GDSwriteInt(GDS_BOXTYPE, data, 1);

  // XY coordinates
  // boundary must be closed, first and last coordinate must be the same
  // minimum of 4 points(triangle)

  for (int i = 0; i < in_BOX.xCor.size() * 2; i++) {
    if (i % 2) {
      corXY[i] = in_BOX.yCor[i / 2];
    } else {
      corXY[i] = in_BOX.xCor[i / 2];
    }
  }

  this->GDSwriteInt(GDS_XY, corXY, in_BOX.xCor.size() * 2);

  // Optional goodies
  if (minimal == false) { // false
    data[0] = in_BOX.propattr;
    this->GDSwriteInt(GDS_PROPATTR, data, 1);

    this->GDSwriteStr(GDS_PROPVALUE, in_BOX.propvalue);
  }

  this->GDSwriteRec(GDS_ENDEL);
}